

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfLong(MapFieldBase *this)

{
  size_t sVar1;
  long *in_RDI;
  size_t size;
  
  WrappedMutex::Lock((WrappedMutex *)0x415f8b);
  sVar1 = (**(code **)(*in_RDI + 0x60))();
  WrappedMutex::Unlock((WrappedMutex *)0x415fa7);
  return sVar1;
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfLong() const {
  mutex_.Lock();
  size_t size = SpaceUsedExcludingSelfNoLock();
  mutex_.Unlock();
  return size;
}